

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

string * expect_eval_exception_abi_cxx11_(string *__return_storage_ptr__,wstring_view *text)

{
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> __args_2;
  version ver;
  type s;
  wostream *__os;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  basic_string_view<char,_std::char_traits<char>_> local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  eval_exception *e_1;
  exception *e_2;
  function<void_(const_mjs::statement_&,_const_mjs::completion_&)> local_100;
  interpreter local_e0;
  interpreter i;
  gc_heap h;
  exception *e;
  shared_ptr<mjs::source_file> local_38;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> local_28;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> local_20;
  unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_> bs;
  wstring_view *text_local;
  
  bs._M_t.super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>.
  _M_t.super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>.
  super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl =
       (__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
       )(__uniq_ptr_data<mjs::block_statement,_std::default_delete<mjs::block_statement>,_true,_true>
         )text;
  std::unique_ptr<mjs::block_statement,std::default_delete<mjs::block_statement>>::
  unique_ptr<std::default_delete<mjs::block_statement>,void>
            ((unique_ptr<mjs::block_statement,std::default_delete<mjs::block_statement>> *)&local_20
            );
  __args_2._M_t.
  super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>.
  super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl =
       bs._M_t.
       super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>._M_t.
       super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>.
       super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl;
  tested_version();
  std::
  make_shared<mjs::source_file,wchar_t_const(&)[5],std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,mjs::version>
            ((wchar_t (*) [5])&local_38,
             (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)L"test",
             (version *)
             __args_2._M_t.
             super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
             ._M_t.
             super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>
             .super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl);
  mjs::parse((mjs *)&local_28,&local_38,non_strict);
  std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::operator=
            (&local_20,&local_28);
  std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::~unique_ptr
            (&local_28);
  std::shared_ptr<mjs::source_file>::~shared_ptr(&local_38);
  mjs::gc_heap::gc_heap((gc_heap *)&i,0x100000);
  ver = tested_version();
  std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::function(&local_100);
  mjs::interpreter::interpreter(&local_e0,(gc_heap *)&i,ver,&local_100);
  std::function<void_(const_mjs::statement_&,_const_mjs::completion_&)>::~function(&local_100);
  s = std::unique_ptr<mjs::block_statement,_std::default_delete<mjs::block_statement>_>::operator*
                (&local_20);
  mjs::interpreter::eval((value *)&e_2,&local_e0,&s->super_statement);
  mjs::value::~value((value *)&e_2);
  mjs::interpreter::~interpreter(&local_e0);
  mjs::gc_heap::~gc_heap((gc_heap *)&i);
  __os = std::operator<<((wostream *)&std::wcout,"Exception not thrown in\n");
  local_168 = *(undefined8 *)
               bs._M_t.
               super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
               ._M_t.
               super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>
               .super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl;
  uStack_160 = *(undefined8 *)
                ((long)bs._M_t.
                       super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>
                       .super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl + 8);
  pbVar1 = std::operator<<(__os,*(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)
                                 bs._M_t.
                                 super___uniq_ptr_impl<mjs::block_statement,_std::default_delete<mjs::block_statement>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_mjs::block_statement_*,_std::default_delete<mjs::block_statement>_>
                                 .super__Head_base<0UL,_mjs::block_statement_*,_false>._M_head_impl)
  ;
  std::operator<<(pbVar1,"\n");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_178,"Expected exception not thrown");
  mjs::throw_runtime_error
            (&local_178,
             "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test.cpp",0x77);
}

Assistant:

std::string expect_eval_exception(const std::wstring_view& text) {
    decltype(parse(nullptr)) bs;
    try {
        bs = parse(std::make_shared<source_file>(L"test", text, tested_version()));
    } catch (const std::exception& e) {
        std::wcout << "Parse failed for \"" << text << "\": " << e.what() <<  "\n";
        throw;
    }

    try {
        gc_heap h{1<<20}; // Use local heap, even if expected lives in another heap
        interpreter i{h, tested_version()};
        (void) i.eval(*bs);
    } catch (const eval_exception& e) {
        return e.what();
    } catch (const std::exception& e) {
        std::wcout << "Unexpected exception thrown: " << e.what() << " while processing\n" << text << "\n"; 
        throw;
    }

    std::wcout << "Exception not thrown in\n" << text << "\n";
    THROW_RUNTIME_ERROR("Expected exception not thrown");
}